

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::GetRandomVectors(SPAdapter *this,Problem *p)

{
  bool bVar1;
  Kind KVar2;
  undefined8 uVar3;
  ExprBase this_00;
  SafeBool SVar4;
  long in_RDI;
  LogicalCon LVar5;
  Expr arg;
  double prob;
  NumericConstant constant;
  int arg_index;
  value_type *rv;
  int num_args;
  CallExpr call;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  relational;
  LogicalExpr expr;
  int con_index;
  int num_logical_cons;
  ExprBase in_stack_fffffffffffffe78;
  RandomVector *in_stack_fffffffffffffe80;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffe88;
  ExprBase in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  CStringRef in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  Error *in_stack_fffffffffffffed8;
  CStringRef in_stack_fffffffffffffee0;
  BasicCStringRef<char> local_118;
  ExprBase local_110;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  Error *in_stack_ffffffffffffff08;
  CStringRef in_stack_ffffffffffffff10;
  BasicCStringRef<char> local_e0;
  double local_d8;
  ExprBase local_d0;
  ExprBase local_c8;
  int local_bc;
  reference local_b8;
  int local_ac;
  BasicCStringRef<char> local_a8;
  ExprBase local_a0;
  Function in_stack_ffffffffffffff68;
  Function in_stack_ffffffffffffff70;
  ExprBase in_stack_ffffffffffffff80;
  ExprBase local_78;
  Impl *local_70;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_60;
  BasicCStringRef<char> local_48;
  BasicProblem<mp::BasicProblemParams<int>_> *local_40;
  int local_38;
  BasicProblem<mp::BasicProblemParams<int>_> *local_30;
  int local_28;
  ExprBase local_20;
  int local_18;
  int local_14;
  
  BasicProblem<mp::BasicProblemParams<int>_>::num_vars
            ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c6e0c);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffea0,CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
            );
  local_14 = BasicProblem<mp::BasicProblemParams<int>_>::num_logical_cons
                       ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c6e26);
  if (local_14 != 0) {
    std::vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>::resize
              ((vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_> *)
               in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      LVar5 = BasicProblem<mp::BasicProblemParams<int>_>::logical_con
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         in_stack_fffffffffffffe90.impl_,
                         (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      local_40 = LVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                 .problem_;
      local_38 = LVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                 .index_;
      local_30 = local_40;
      local_28 = local_38;
      local_20.impl_ =
           (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                   BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   ::expr((BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffe78.impl_);
      KVar2 = internal::ExprBase::kind((ExprBase *)0x1c6ed7);
      if (KVar2 != LAST_RELATIONAL) {
        uVar3 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"logical constraint");
        MakeUnsupportedError<>(in_stack_fffffffffffffeb8);
        __cxa_throw(uVar3,&UnsupportedError::typeinfo,UnsupportedError::~UnsupportedError);
      }
      local_70 = local_20.impl_;
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                (in_stack_fffffffffffffe88,
                 (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)in_stack_fffffffffffffe90.impl_,
                 (type_conflict1)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      local_60.super_ExprBase.impl_ =
           (ExprBase)
           Cast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
                     ((Expr)in_stack_fffffffffffffe78.impl_);
      this_00.impl_ =
           (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                   ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                          *)in_stack_fffffffffffffe78.impl_);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_fffffffffffffe88,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffe90.impl_,
                 (type_conflict1)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      local_78.impl_ = (Impl *)Cast<mp::CallExpr>((Expr)in_stack_fffffffffffffe78.impl_);
      SVar4 = internal::ExprBase::operator_cast_to_function_pointer(&local_78);
      in_stack_fffffffffffffe9c = CONCAT13(1,(int3)in_stack_fffffffffffffe9c);
      if (SVar4 != 0) {
        in_stack_ffffffffffffff70 = CallExpr::function((CallExpr *)in_stack_fffffffffffffe78.impl_);
        in_stack_ffffffffffffff68.impl_ = *(Impl **)(in_RDI + 0x40);
        bVar1 = Function::operator!=((Function *)&stack0xffffffffffffff70,in_stack_ffffffffffffff68)
        ;
        in_stack_fffffffffffffe9c = CONCAT13(1,(int3)in_stack_fffffffffffffe9c);
        if (!bVar1) {
          local_a0.impl_ =
               (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                       ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                              *)in_stack_fffffffffffffe78.impl_);
          bVar1 = IsZero((NumericExpr)in_stack_fffffffffffffe90.impl_);
          in_stack_fffffffffffffe9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c) ^ 0xff000000;
        }
      }
      if ((in_stack_fffffffffffffe9c & 0x1000000) != 0) {
        uVar3 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_a8,"logical constraint");
        MakeUnsupportedError<>(in_stack_fffffffffffffeb8);
        __cxa_throw(uVar3,&UnsupportedError::typeinfo,UnsupportedError::~UnsupportedError);
      }
      local_ac = CallExpr::num_args((CallExpr *)0x1c70e7);
      if (local_ac != 0) {
        local_b8 = std::
                   vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                   ::operator[]((vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                                 *)(in_RDI + 0xf0),(long)local_18);
        for (local_bc = 0; local_bc < local_ac; local_bc = local_bc + 1) {
          local_d0.impl_ = (Impl *)CallExpr::arg((CallExpr *)in_stack_fffffffffffffe78.impl_,0);
          local_c8.impl_ = (Impl *)Cast<mp::NumericConstant>((Expr)in_stack_fffffffffffffe78.impl_);
          SVar4 = internal::ExprBase::operator_cast_to_function_pointer(&local_c8);
          if (SVar4 == 0) break;
          local_d8 = NumericConstant::value((NumericConstant *)0x1c7193);
          if ((local_d8 < 0.0) || (1.0 < local_d8)) {
            uVar6 = 1;
            uVar3 = __cxa_allocate_exception(0x18);
            fmt::BasicCStringRef<char>::BasicCStringRef(&local_e0,"{}: invalid probability {}");
            (anonymous_namespace)::lcon_name_abi_cxx11_(in_stack_fffffffffffffe9c);
            Error::Error<std::__cxx11::string,double>
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff00
                       ,(double *)CONCAT17(uVar6,in_stack_fffffffffffffef8));
            __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
          }
          RandomVector::AddProbability
                    (in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78.impl_);
        }
        while (local_bc < local_ac) {
          local_110.impl_ = (Impl *)CallExpr::arg((CallExpr *)in_stack_fffffffffffffe78.impl_,0);
          KVar2 = internal::ExprBase::kind((ExprBase *)0x1c7308);
          if (KVar2 != FIRST_REFERENCE) {
            uVar3 = __cxa_allocate_exception(0x18);
            fmt::BasicCStringRef<char>::BasicCStringRef
                      (&local_118,"{}: expected variable or constant");
            (anonymous_namespace)::lcon_name_abi_cxx11_(in_stack_fffffffffffffe9c);
            Error::Error<std::__cxx11::string>
                      (in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed0
                      );
            __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
          }
          in_stack_fffffffffffffeb8.data_ = (char *)local_78.impl_;
          GetRealizations((SPAdapter *)this_00.impl_,
                          (int)((ulong)in_stack_ffffffffffffff70.impl_ >> 0x20),
                          (CallExpr)in_stack_ffffffffffffff80.impl_,
                          (int *)in_stack_ffffffffffffff68.impl_);
        }
      }
    }
  }
  return;
}

Assistant:

void SPAdapter::GetRandomVectors(const Problem &p) {
  var_orig2core_.resize(p.num_vars());
  int num_logical_cons = p.num_logical_cons();
  if (num_logical_cons == 0)
    return;
  rvs_.resize(num_logical_cons);
  for (int con_index = 0; con_index < num_logical_cons; ++con_index) {
    auto expr = p.logical_con(con_index).expr();
    if (expr.kind() != expr::NE)
      throw MakeUnsupportedError("logical constraint");
    auto relational = Cast<RelationalExpr>(expr);
    auto call = Cast<CallExpr>(relational.lhs());
    if (!call || call.function() != random_ || !IsZero(relational.rhs()))
      throw MakeUnsupportedError("logical constraint");
    int num_args = call.num_args();
    if (num_args == 0)
      continue;
    auto &rv = rvs_[con_index];
    int arg_index = 0;
    // Get probabilities.
    for (; arg_index < num_args; ++arg_index) {
      auto constant = Cast<NumericConstant>(call.arg(arg_index));
      if (!constant) break;
      double prob = constant.value();
      if (prob < 0 || prob > 1)
        throw Error("{}: invalid probability {}", lcon_name(con_index), prob);
      rv.AddProbability(prob);
    }
    // Get realizations.
    while (arg_index < num_args) {
      auto arg = call.arg(arg_index);
      if (arg.kind() != expr::VARIABLE)
        throw Error("{}: expected variable or constant", lcon_name(con_index));
      GetRealizations(con_index, call, arg_index);
    }
  }
}